

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa.cpp
# Opt level: O0

void __thiscall mocker::SSADestruction::replacePhisWithParallelCopies(SSADestruction *this)

{
  bool bVar1;
  BasicBlockList *this_00;
  reference this_01;
  InstList *this_02;
  element_type *peVar2;
  shared_ptr<mocker::ir::Reg> *__r;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *this_03;
  element_type *this_04;
  list<mocker::SSADestruction::Copy,std::allocator<mocker::SSADestruction::Copy>> *this_05;
  element_type *this_06;
  string *__k;
  shared_ptr<mocker::ir::Load> local_128;
  shared_ptr<mocker::ir::Addr> local_118;
  shared_ptr<mocker::ir::Reg> local_108;
  size_t local_f8;
  reference local_f0;
  pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *option;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
  *__range3;
  undefined1 local_c0 [8];
  shared_ptr<mocker::ir::Reg> dest;
  undefined1 local_a8 [8];
  shared_ptr<mocker::ir::Phi> phi;
  shared_ptr<mocker::ir::IRInst> *inst;
  iterator __end2;
  iterator __begin2;
  InstList *__range2;
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  BasicBlockList *__range1;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  preds;
  SSADestruction *this_local;
  
  preds._M_h._M_single_bucket = (__node_base_ptr)this;
  buildBlockPredecessors
            ((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              *)&__range1,(this->super_FuncPass).func);
  this_00 = ir::FunctionModule::getMutableBBs_abi_cxx11_((this->super_FuncPass).func);
  __end1 = std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::
           begin(this_00);
  bb = (BasicBlock *)
       std::__cxx11::list<mocker::ir::BasicBlock,_std::allocator<mocker::ir::BasicBlock>_>::end
                 (this_00);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&bb);
    if (!bVar1) {
      std::
      unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~unordered_map((unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)&__range1);
      return;
    }
    this_01 = std::_List_iterator<mocker::ir::BasicBlock>::operator*(&__end1);
    this_02 = ir::BasicBlock::getMutableInsts_abi_cxx11_(this_01);
    __end2 = std::__cxx11::
             list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
             ::begin(this_02);
    inst = (shared_ptr<mocker::ir::IRInst> *)
           std::__cxx11::
           list<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ::end(this_02);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&inst), bVar1) {
      phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator*(&__end2);
      ir::dyc<mocker::ir::Phi,std::shared_ptr<mocker::ir::IRInst>&>
                ((ir *)local_a8,
                 (shared_ptr<mocker::ir::IRInst> *)
                 phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_a8);
      if (bVar1) {
        peVar2 = std::__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_a8);
        __r = ir::Definition::getDest(&peVar2->super_Definition);
        std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                  ((shared_ptr<mocker::ir::Addr> *)&__range3,__r);
        ir::dycLocalReg((ir *)local_c0,(shared_ptr<mocker::ir::Addr> *)&__range3);
        std::shared_ptr<mocker::ir::Addr>::~shared_ptr((shared_ptr<mocker::ir::Addr> *)&__range3);
        peVar2 = std::__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_a8);
        this_03 = ir::Phi::getOptions(peVar2);
        __end3 = std::
                 vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ::begin(this_03);
        option = (pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_> *)
                 std::
                 vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>
                 ::end(this_03);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                                           *)&option), bVar1) {
          local_f0 = __gnu_cxx::
                     __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
                     ::operator*(&__end3);
          this_04 = std::
                    __shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&local_f0->second);
          local_f8 = ir::Label::getID(this_04);
          this_05 = (list<mocker::SSADestruction::Copy,std::allocator<mocker::SSADestruction::Copy>>
                     *)std::
                       unordered_map<unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mocker::SSADestruction::Copy,_std::allocator<mocker::SSADestruction::Copy>_>_>_>_>
                       ::operator[](&this->parallelCopies,&local_f8);
          std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                    (&local_118,(shared_ptr<mocker::ir::Reg> *)local_c0);
          ir::dycLocalReg((ir *)&local_108,&local_118);
          std::__cxx11::
          list<mocker::SSADestruction::Copy,std::allocator<mocker::SSADestruction::Copy>>::
          emplace_back<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Addr>const&>
                    (this_05,&local_108,&local_f0->first);
          std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_108);
          std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_118);
          __gnu_cxx::
          __normal_iterator<const_std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_*,_std::vector<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>,_std::allocator<std::pair<std::shared_ptr<mocker::ir::Addr>,_std::shared_ptr<mocker::ir::Label>_>_>_>_>
          ::operator++(&__end3);
        }
        this_06 = std::
                  __shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_c0);
        __k = ir::Reg::getIdentifier_abi_cxx11_(this_06);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ir::Reg>_>_>_>
        ::at(&this->addresses,__k);
        std::
        make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                  ((shared_ptr<mocker::ir::Reg> *)&local_128,(shared_ptr<mocker::ir::Reg> *)local_c0
                  );
        std::shared_ptr<mocker::ir::IRInst>::operator=
                  ((shared_ptr<mocker::ir::IRInst> *)
                   phi.super___shared_ptr<mocker::ir::Phi,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi,&local_128);
        std::shared_ptr<mocker::ir::Load>::~shared_ptr(&local_128);
        std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_c0);
        dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = 0;
      }
      else {
        dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
             = 4;
      }
      std::shared_ptr<mocker::ir::Phi>::~shared_ptr((shared_ptr<mocker::ir::Phi> *)local_a8);
      if (dest.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ != 0) break;
      std::_List_iterator<std::shared_ptr<mocker::ir::IRInst>_>::operator++(&__end2);
    }
    std::_List_iterator<mocker::ir::BasicBlock>::operator++(&__end1);
  } while( true );
}

Assistant:

void SSADestruction::replacePhisWithParallelCopies() {
  auto preds = buildBlockPredecessors(func);

  for (auto &bb : func.getMutableBBs()) {
    for (auto &inst : bb.getMutableInsts()) {
      auto phi = ir::dyc<ir::Phi>(inst);
      if (!phi)
        break;

      auto dest = ir::dycLocalReg(phi->getDest());
      for (auto &option : phi->getOptions())
        parallelCopies[option.second->getID()].emplace_back(
            ir::dycLocalReg(dest), option.first);
      inst =
          std::make_shared<ir::Load>(dest, addresses.at(dest->getIdentifier()));
    }
  }
}